

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_AtomIsNumericIndex1(JSContext *ctx,JSAtom atom)

{
  JSValueUnion ctx_00;
  uint uVar1;
  int iVar2;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  wchar16 *__s2;
  void *__s1;
  list_head **pplVar7;
  JSRefCountHeader *p;
  JSValue JVar8;
  JSValue JVar9;
  size_t sStack_40;
  ulong uVar3;
  
  if ((int)atom < 0) {
    return (JSValue)ZEXT416(atom & 0x7fffffff);
  }
  ctx_00 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + atom))->ptr;
  if ((uint)((ulong)*(undefined8 *)((long)ctx_00.ptr + 4) >> 0x3e) != 1) goto LAB_0011c32d;
  uVar6 = (uint)*(undefined8 *)((long)ctx_00.ptr + 4);
  uVar1 = uVar6 & 0x7fffffff;
  uVar3 = (ulong)uVar1;
  if ((int)uVar6 < 0) {
    if (uVar3 == 0) goto LAB_0011c32d;
    uVar5 = *(ushort *)((long)ctx_00.ptr + 0x10);
    if (uVar5 == 0x2d) {
      uVar5 = *(ushort *)((long)ctx_00.ptr + 0x12);
      if (uVar1 == 2 && uVar5 == 0x30) goto LAB_0011c205;
      pplVar7 = (list_head **)((long)ctx_00.ptr + 0x12);
    }
    else {
      pplVar7 = (list_head **)((long)ctx_00.ptr + 0x10);
    }
    if (uVar5 - 0x3a < 0xfffffff6) {
      if (uVar5 != 0x49) {
        return (JSValue)(ZEXT816(3) << 0x40);
      }
      if ((long)ctx_00.ptr + ((uVar3 * 2 + 0x10) - (long)pplVar7) != 0x10) {
        return (JSValue)(ZEXT816(3) << 0x40);
      }
      __s1 = (void *)((long)pplVar7 + 2);
      __s2 = L"nfinity";
      sStack_40 = 0xe;
      goto LAB_0011c29c;
    }
  }
  else {
    if (uVar3 == 0) goto LAB_0011c32d;
    bVar4 = *(byte *)((long)ctx_00.ptr + 0x10);
    if (bVar4 == 0x2d) {
      bVar4 = *(byte *)((long)ctx_00.ptr + 0x11);
      if (uVar1 == 2 && bVar4 == 0x30) {
LAB_0011c205:
        JVar8.tag = 7;
        JVar8.u.float64 = -0.0;
        return JVar8;
      }
      pplVar7 = (list_head **)((long)ctx_00.ptr + 0x11);
    }
    else {
      pplVar7 = (list_head **)((long)ctx_00.ptr + 0x10);
    }
    if (bVar4 - 0x3a < 0xfffffff6) {
      if (bVar4 != 0x49) {
        return (JSValue)(ZEXT816(3) << 0x40);
      }
      if ((long)ctx_00.ptr + ((uVar3 + 0x10) - (long)pplVar7) != 8) {
        return (JSValue)(ZEXT816(3) << 0x40);
      }
      __s1 = (void *)((long)pplVar7 + 1);
      __s2 = L"nfinity";
      sStack_40 = 7;
LAB_0011c29c:
      iVar2 = bcmp(__s1,__s2,sStack_40);
      if (iVar2 != 0) goto LAB_0011c32d;
    }
  }
  *(int *)ctx_00.ptr = *ctx_00.ptr + 1;
  JVar9.tag = -7;
  JVar9.u.ptr = ctx_00.ptr;
  JVar8 = JS_ToNumberFree(ctx,JVar9);
  if ((int)JVar8.tag == 6) {
    return JVar8;
  }
  JVar9 = JS_ToString(ctx,JVar8);
  if ((int)JVar9.tag == 6) {
    JS_FreeValue(ctx,JVar8);
    return JVar9;
  }
  iVar2 = js_string_compare((JSContext *)ctx_00.ptr,(JSString *)JVar9.u.ptr,(JSString *)JVar9.tag);
  JS_FreeValue(ctx,JVar9);
  if (iVar2 == 0) {
    return JVar8;
  }
  JS_FreeValue(ctx,JVar8);
LAB_0011c32d:
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue JS_AtomIsNumericIndex1(JSContext *ctx, JSAtom atom)
{
    JSRuntime *rt = ctx->rt;
    JSAtomStruct *p1;
    JSString *p;
    int c, len, ret;
    JSValue num, str;

    if (__JS_AtomIsTaggedInt(atom))
        return JS_NewInt32(ctx, __JS_AtomToUInt32(atom));
    assert(atom < rt->atom_size);
    p1 = rt->atom_array[atom];
    if (p1->atom_type != JS_ATOM_TYPE_STRING)
        return JS_UNDEFINED;
    p = p1;
    len = p->len;
    if (p->is_wide_char) {
        const uint16_t *r = p->u.str16, *r_end = p->u.str16 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2)
                goto minus_zero;
        }
        /* XXX: should test NaN, but the tests do not check it */
        if (!is_num(c)) {
            /* XXX: String should be normalized, therefore 8-bit only */
            const uint16_t nfinity16[7] = { 'n', 'f', 'i', 'n', 'i', 't', 'y' };
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, nfinity16, sizeof(nfinity16))))
                return JS_UNDEFINED;
        }
    } else {
        const uint8_t *r = p->u.str8, *r_end = p->u.str8 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2) {
            minus_zero:
                return __JS_NewFloat64(ctx, -0.0);
            }
        }
        if (!is_num(c)) {
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, "nfinity", 7)))
                return JS_UNDEFINED;
        }
    }
    /* XXX: bignum: would be better to only accept integer to avoid
       relying on current floating point precision */
    /* this is ECMA CanonicalNumericIndexString primitive */
    num = JS_ToNumber(ctx, JS_MKPTR(JS_TAG_STRING, p));
    if (JS_IsException(num))
        return num;
    str = JS_ToString(ctx, num);
    if (JS_IsException(str)) {
        JS_FreeValue(ctx, num);
        return str;
    }
    ret = js_string_compare(ctx, p, JS_VALUE_GET_STRING(str));
    JS_FreeValue(ctx, str);
    if (ret == 0) {
        return num;
    } else {
        JS_FreeValue(ctx, num);
        return JS_UNDEFINED;
    }
}